

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int ftp_compress_open(char *url,int rwmode,int *handle)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int local_9b0;
  int iStack_9ac;
  char firstchar;
  int sock;
  int status;
  int flen;
  int ii;
  long len;
  char recbuf [1200];
  char errorstr [1200];
  FILE *command;
  FILE *ftpfile;
  int *handle_local;
  char *pcStack_18;
  int rwmode_local;
  char *url_local;
  
  closeftpfile = 0;
  closecommandfile = 0;
  closememfile = 0;
  closefdiskfile = 0;
  closediskfile = 0;
  ftpfile = (FILE *)handle;
  handle_local._4_4_ = rwmode;
  pcStack_18 = url;
  if (rwmode != 0) {
    ffpmsg("Compressed files must be r/o");
    return 0x68;
  }
  sVar2 = strlen(netoutfile);
  sock = (int)sVar2;
  if (sock == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (ftp_compress_open)");
    return 0x68;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)env);
  if (iVar1 == 0) {
    signal(0xe,signal_handler);
    alarm(net_timeout);
    iStack_9ac = ftp_open_network(pcStack_18,&command,(FILE **)(errorstr + 0x4a8),&local_9b0);
    if (iStack_9ac == 0) {
      closeftpfile = closeftpfile + 1;
      closecommandfile = closecommandfile + 1;
      iVar1 = fgetc((FILE *)command);
      ungetc((int)(char)iVar1,(FILE *)command);
      pcVar3 = strstr(pcStack_18,".gz");
      if (((pcVar3 == (char *)0x0) && (pcVar3 = strstr(pcStack_18,".Z"), pcVar3 == (char *)0x0)) &&
         ((char)iVar1 != '\x1f')) {
        ffpmsg("Can only compressed files here (ftp_compress_open)");
      }
      else {
        if (netoutfile[0] == '!') {
          for (status = 0; status < sock; status = status + 1) {
            netoutfile[status] = netoutfile[status + 1];
          }
          iStack_9ac = file_remove(netoutfile);
        }
        iStack_9ac = file_create(netoutfile,&ftpfile->_flags);
        if (iStack_9ac == 0) {
          closediskfile = closediskfile + 1;
          alarm(net_timeout);
          while (_flen = fread(&len,1,0x4b0,(FILE *)command), _flen != 0) {
            alarm(0);
            iStack_9ac = file_write(ftpfile->_flags,&len,_flen);
            if (iStack_9ac != 0) {
              ffpmsg("Error writing file (ftp_compres_open)");
              ffpmsg(pcStack_18);
              ffpmsg(netoutfile);
              goto LAB_001407bf;
            }
            alarm(net_timeout);
          }
          file_close(ftpfile->_flags);
          closediskfile = closediskfile + -1;
          fclose((FILE *)command);
          closeftpfile = closeftpfile + -1;
          fclose((FILE *)errorstr._1192_8_);
          NET_SendRaw(local_9b0,"QUIT\r\n",6,0);
          closecommandfile = closecommandfile + -1;
          diskfile = (FILE *)fopen(netoutfile,"r");
          if ((FILE *)diskfile == (FILE *)0x0) {
            ffpmsg("Unable to reopen disk file (ftp_compress_open)");
            ffpmsg(netoutfile);
            return 0x68;
          }
          closefdiskfile = closefdiskfile + 1;
          iStack_9ac = mem_create(pcStack_18,&ftpfile->_flags);
          if (iStack_9ac == 0) {
            closememfile = closememfile + 1;
            iStack_9ac = 0;
            iStack_9ac = mem_uncompress2mem(pcStack_18,diskfile,ftpfile->_flags);
            fclose((FILE *)diskfile);
            closefdiskfile = closefdiskfile + -1;
            if (iStack_9ac == 0) {
              signal(0xe,(__sighandler_t)0x0);
              alarm(0);
              iVar1 = mem_seek(ftpfile->_flags,0);
              return iVar1;
            }
            ffpmsg("Error writing compressed memory file (ftp_compress_open)");
          }
          else {
            ffpmsg("Unable to create memory file (ftp_compress_open)");
            ffpmsg(pcStack_18);
          }
        }
        else {
          ffpmsg("Unable to create output file (ftp_compress_open)");
          ffpmsg(netoutfile);
        }
      }
    }
    else {
      alarm(0);
      ffpmsg("Unable to open ftp file (ftp_compress_open)");
      ffpmsg(pcStack_18);
    }
  }
  else {
    ffpmsg("Timeout (ftp_compress_open)");
    snprintf(recbuf + 0x4a8,0x4b0,"Download timeout exceeded: %d seconds");
    ffpmsg(recbuf + 0x4a8);
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
  }
LAB_001407bf:
  alarm(0);
  if (closeftpfile != 0) {
    fclose((FILE *)command);
  }
  if (closecommandfile != 0) {
    fclose((FILE *)errorstr._1192_8_);
    NET_SendRaw(local_9b0,"QUIT\r\n",6,0);
  }
  if (closefdiskfile != 0) {
    fclose((FILE *)diskfile);
  }
  if (closememfile != 0) {
    mem_close_free(ftpfile->_flags);
  }
  if (closediskfile != 0) {
    file_close(ftpfile->_flags);
  }
  signal(0xe,(__sighandler_t)0x0);
  return 0x68;
}

Assistant:

int ftp_compress_open(char *url, int rwmode, int *handle)
{
  FILE *ftpfile;
  FILE *command;
  char errorstr[MAXLEN];
  char recbuf[MAXLEN];
  long len;
  int ii, flen, status;
  int sock;
  char firstchar;

  closeftpfile = 0;
  closecommandfile = 0;
  closememfile = 0;
  closefdiskfile = 0;
  closediskfile = 0;

  /* don't do r/w files */
  if (rwmode != 0) {
    ffpmsg("Compressed files must be r/o");
    return (FILE_NOT_OPENED);
  }
  
  /* Need to know where to write the output file */
  flen = strlen(netoutfile);
  if (!flen) 
    {
      ffpmsg(
	"Output file not set, shouldn't have happened (ftp_compress_open)");
      return (FILE_NOT_OPENED);
    }
  
  /* do the signal handler bits */
  if (setjmp(env) != 0) {
    /* feels like the second time */
    /* this means something bad happened */
    ffpmsg("Timeout (ftp_compress_open)");
    snprintf(errorstr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
    ffpmsg(errorstr);
    ffpmsg("   Timeout may be adjusted with fits_set_timeout");
    goto error;
  }
  
  signal(SIGALRM, signal_handler);
  
  /* Open the network connection to url, ftpfile is connected to the file 
     port, command is connected to port 21.  sock is for writing to port 21 */
  alarm(net_timeout);

  if ((status = ftp_open_network(url,&ftpfile,&command,&sock))) {
    alarm(0);
    ffpmsg("Unable to open ftp file (ftp_compress_open)");
    ffpmsg(url);
    goto error;
  }
  closeftpfile++;
  closecommandfile++;

  /* Now, what do we do with the file */
  firstchar = fgetc(ftpfile);
  ungetc(firstchar,ftpfile);

  if (strstr(url,".gz") || 
      strstr(url,".Z") ||
      ('\037' == firstchar)) {
  
    if (*netoutfile == '!')
    {
       /* user wants to clobber file, if it already exists */
       for (ii = 0; ii < flen; ii++)
          netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

       status = file_remove(netoutfile);
    }

    /* Create the output file */
    if ((status =  file_create(netoutfile,handle))) {
      ffpmsg("Unable to create output file (ftp_compress_open)");
      ffpmsg(netoutfile);
      goto error;
    }
    closediskfile++;
    
    /* write a file */
    alarm(net_timeout);
    while(0 != (len = fread(recbuf,1,MAXLEN,ftpfile))) {
      alarm(0);
      status = file_write(*handle,recbuf,len);
      if (status) {
	ffpmsg("Error writing file (ftp_compres_open)");
        ffpmsg(url);
        ffpmsg(netoutfile);
	goto error;
      }
      alarm(net_timeout);
    }

    file_close(*handle);
    closediskfile--;
    fclose(ftpfile);
    closeftpfile--;
    /* Close down the ftp connection */
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
    closecommandfile--;

    /* File is on disk, let's uncompress it into memory */

    if (NULL == (diskfile = fopen(netoutfile,"r"))) {
      ffpmsg("Unable to reopen disk file (ftp_compress_open)");
      ffpmsg(netoutfile);
      return (FILE_NOT_OPENED);
    }
    closefdiskfile++;
  
    if ((status =  mem_create(url,handle))) {
      ffpmsg("Unable to create memory file (ftp_compress_open)");
      ffpmsg(url);
      goto error;
    }
    closememfile++;

    status = 0;
    status = mem_uncompress2mem(url,diskfile,*handle);
    fclose(diskfile);
    closefdiskfile--;

    if (status) {
      ffpmsg("Error writing compressed memory file (ftp_compress_open)");
      goto error;
    }
      
  } else {
    /* Opps, this should not have happened */
    ffpmsg("Can only compressed files here (ftp_compress_open)");
    goto error;
  }    
    

  signal(SIGALRM, SIG_DFL);
  alarm(0);
  return mem_seek(*handle,0);

 error:
  alarm(0); /* clear it */
  if (closeftpfile) {
    fclose(ftpfile);
  }
  if (closecommandfile) {
    fclose(command);
    NET_SendRaw(sock,"QUIT\r\n",6,NET_DEFAULT);
  }
  if (closefdiskfile) {
    fclose(diskfile);
  }
  if (closememfile) {
    mem_close_free(*handle);
  }
  if (closediskfile) {
    file_close(*handle);
  } 
  
  signal(SIGALRM, SIG_DFL);
  return (FILE_NOT_OPENED);
}